

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmNinjaTargetGenerator::ComputeIncludes
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language)

{
  pointer pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  cmGeneratorTarget *headTarget;
  char *expression;
  string *psVar3;
  string config;
  string local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string INCLUDE_DIRECTORIES;
  string local_d8;
  string local_b8;
  cmGeneratorExpressionInterpreter genexInterpreter;
  
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  config._M_dataplus._M_p = (pointer)&config.field_2;
  pcVar1 = (this->LocalGenerator->super_cmLocalCommonGenerator).ConfigName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&config,pcVar1,
             pcVar1 + (this->LocalGenerator->super_cmLocalCommonGenerator).ConfigName.
                      _M_string_length);
  pcVar2 = this->LocalGenerator;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,config._M_dataplus._M_p,
             config._M_dataplus._M_p + config._M_string_length);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar1 = (language->_M_dataplus)._M_p;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar1,pcVar1 + language->_M_string_length);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&genexInterpreter,(cmLocalGenerator *)pcVar2,&local_138,headTarget,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  INCLUDE_DIRECTORIES._M_dataplus._M_p = (pointer)&INCLUDE_DIRECTORIES.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&INCLUDE_DIRECTORIES,"INCLUDE_DIRECTORIES","");
  expression = cmSourceFile::GetProperty(source,&INCLUDE_DIRECTORIES);
  if (expression != (char *)0x0) {
    pcVar2 = this->LocalGenerator;
    psVar3 = cmGeneratorExpressionInterpreter::Evaluate
                       (&genexInterpreter,expression,&INCLUDE_DIRECTORIES);
    cmLocalGenerator::AppendIncludeDirectories
              ((cmLocalGenerator *)pcVar2,&includes,(psVar3->_M_dataplus)._M_p,source);
  }
  cmLocalGenerator::GetIncludeFlags
            (__return_storage_ptr__,(cmLocalGenerator *)this->LocalGenerator,&includes,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,language,true,false,&config);
  pcVar2 = this->LocalGenerator;
  cmCommonTargetGenerator::GetIncludes(&local_b8,&this->super_cmCommonTargetGenerator,language);
  (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
            (pcVar2,__return_storage_ptr__,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)INCLUDE_DIRECTORIES._M_dataplus._M_p != &INCLUDE_DIRECTORIES.field_2) {
    operator_delete(INCLUDE_DIRECTORIES._M_dataplus._M_p,
                    INCLUDE_DIRECTORIES.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)genexInterpreter.Language._M_dataplus._M_p != &genexInterpreter.Language.field_2) {
    operator_delete(genexInterpreter.Language._M_dataplus._M_p,
                    genexInterpreter.Language.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)genexInterpreter.Config._M_dataplus._M_p != &genexInterpreter.Config.field_2) {
    operator_delete(genexInterpreter.Config._M_dataplus._M_p,
                    genexInterpreter.Config.field_2._M_allocated_capacity + 1);
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&genexInterpreter.CompiledGeneratorExpression);
  cmGeneratorExpression::~cmGeneratorExpression(&genexInterpreter.GeneratorExpression);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)config._M_dataplus._M_p != &config.field_2) {
    operator_delete(config._M_dataplus._M_p,config.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeIncludes(
  cmSourceFile const* source, const std::string& language)
{
  std::vector<std::string> includes;
  const std::string config = this->LocalGenerator->GetConfigName();
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  const std::string INCLUDE_DIRECTORIES("INCLUDE_DIRECTORIES");
  if (const char* cincludes = source->GetProperty(INCLUDE_DIRECTORIES)) {
    this->LocalGenerator->AppendIncludeDirectories(
      includes, genexInterpreter.Evaluate(cincludes, INCLUDE_DIRECTORIES),
      *source);
  }

  std::string includesString = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, language, true, false, config);
  this->LocalGenerator->AppendFlags(includesString,
                                    this->GetIncludes(language));

  return includesString;
}